

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

clock_t __thiscall lest::times::~times(times *this,tms *__buffer)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  clock_t extraout_RAX;
  clock_t extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  poVar3 = (this->super_action).os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Elapsed time: ",0xe);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 1;
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>
                     ((double)((lVar2 - (this->total).start.__d.__r) / 1000) * 1e-06);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," s\n",3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  paVar4 = &(this->output).testing.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return extraout_RAX_00;
  }
  return extraout_RAX;
}

Assistant:

~times()
    {
        os << "Elapsed time: " << std::setprecision(1) << total.elapsed_seconds() << " s\n";
    }